

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListEnlarge(Parse *pParse,SrcList *pSrc,int nExtra,int iStart)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  
  bVar9 = 0;
  iVar1 = pSrc->nSrc;
  if (pSrc->nAlloc < (uint)(iVar1 + nExtra)) {
    if (199 < iVar1 + nExtra) {
      sqlite3ErrorMsg(pParse,"too many FROM clause terms, max: %d",200);
      return (SrcList *)0x0;
    }
    lVar6 = (ulong)(uint)nExtra + (long)iVar1 * 2;
    lVar7 = 200;
    if (lVar6 < 200) {
      lVar7 = lVar6;
    }
    pSrc = (SrcList *)sqlite3DbRealloc(pParse->db,pSrc,lVar7 * 0x70 | 8);
    if (pSrc == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    pSrc->nAlloc = (u32)lVar7;
    iVar1 = pSrc->nSrc;
  }
  lVar6 = (long)iVar1;
  lVar8 = (long)iStart;
  lVar7 = lVar6 * 0x70 + -0x68;
  while (lVar8 < lVar6) {
    lVar6 = lVar6 + -1;
    puVar4 = (undefined8 *)((long)pSrc->a + lVar7 + -8);
    puVar5 = (undefined8 *)((long)pSrc->a + lVar7 + (long)nExtra * 0x70 + -8);
    for (lVar2 = 0xe; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar9 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    }
    lVar7 = lVar7 + -0x70;
  }
  pSrc->nSrc = pSrc->nSrc + nExtra;
  memset(pSrc->a + lVar8,0,(ulong)(uint)nExtra * 0x70);
  piVar3 = &pSrc->a[lVar8].iCursor;
  for (; lVar8 < nExtra + iStart; lVar8 = lVar8 + 1) {
    *piVar3 = -1;
    piVar3 = piVar3 + 0x1c;
  }
  return pSrc;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  Parse *pParse,     /* Parsing context into which errors are reported */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    sqlite3_int64 nAlloc = 2*(sqlite3_int64)pSrc->nSrc+nExtra;
    sqlite3 *db = pParse->db;

    if( pSrc->nSrc+nExtra>=SQLITE_MAX_SRCLIST ){
      sqlite3ErrorMsg(pParse, "too many FROM clause terms, max: %d",
                      SQLITE_MAX_SRCLIST);
      return 0;
    }
    if( nAlloc>SQLITE_MAX_SRCLIST ) nAlloc = SQLITE_MAX_SRCLIST;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return 0;
    }
    pSrc = pNew;
    pSrc->nAlloc = nAlloc;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}